

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

string * __thiscall
BCLog::Logger::GetLogPrefix_abi_cxx11_(Logger *this,LogFlags category,Level level)

{
  int in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  bool has_category;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined7 in_stack_ffffffffffffff60;
  byte bVar1;
  allocator<char> *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined1 uVar2;
  Level level_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_49 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    in_RDX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
    ;
  }
  bVar1 = (*(byte *)(in_RSI + 0xd6) & 1) != 0 ||
          in_RDX != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    0xffffffffffffffff;
  if (((bool)bVar1) || (in_ECX != 2)) {
    uVar2 = 0;
    this_00 = local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDX,(char *)CONCAT44(in_ECX,CONCAT13(bVar1,CONCAT12(uVar2,
                                                  in_stack_ffffffffffffff90))),
               in_stack_ffffffffffffff88);
    std::allocator<char>::~allocator((allocator<char> *)local_49);
    if ((bVar1 & 1) != 0) {
      LogCategoryToStr_abi_cxx11_((LogFlags)in_RDX);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (this_00,in_stack_ffffffffffffff50);
      std::__cxx11::string::~string(in_stack_ffffffffffffff48);
    }
    level_00 = (Level)((ulong)in_RDX >> 0x20);
    if ((((*(byte *)(in_RSI + 0xd6) & 1) != 0) || ((bVar1 & 1) == 0)) || (in_ECX != 1)) {
      if ((bVar1 & 1) != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (this_00,(char *)in_stack_ffffffffffffff50);
      }
      LogLevelToStr_abi_cxx11_(level_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (this_00,in_stack_ffffffffffffff50);
      std::__cxx11::string::~string(in_stack_ffffffffffffff48);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this_00,(char *)in_stack_ffffffffffffff50);
  }
  else {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_ffffffffffffff60));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string BCLog::Logger::GetLogPrefix(BCLog::LogFlags category, BCLog::Level level) const
{
    if (category == LogFlags::NONE) category = LogFlags::ALL;

    const bool has_category{m_always_print_category_level || category != LogFlags::ALL};

    // If there is no category, Info is implied
    if (!has_category && level == Level::Info) return {};

    std::string s{"["};
    if (has_category) {
        s += LogCategoryToStr(category);
    }

    if (m_always_print_category_level || !has_category || level != Level::Debug) {
        // If there is a category, Debug is implied, so don't add the level

        // Only add separator if we have a category
        if (has_category) s += ":";
        s += Logger::LogLevelToStr(level);
    }

    s += "] ";
    return s;
}